

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Operator.cpp
# Opt level: O0

void __thiscall
adios2::core::Operator::RunCallback1
          (Operator *this,uint32_t *arg0,string *arg1,string *arg2,string *arg3,size_t arg4,
          Dims *arg5,Dims *arg6,Dims *arg7)

{
  string *in_stack_000000b8;
  Operator *in_stack_000000c0;
  allocator local_51;
  string local_50 [80];
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_50,"Callback1",&local_51);
  CheckCallbackType(in_stack_000000c0,in_stack_000000b8);
  std::__cxx11::string::~string(local_50);
  std::allocator<char>::~allocator((allocator<char> *)&local_51);
  return;
}

Assistant:

void Operator::RunCallback2(void *arg0, const std::string &arg1, const std::string &arg2,
                            const std::string &arg3, const size_t arg4, const Dims &arg5,
                            const Dims &arg6, const Dims &arg7) const
{
    CheckCallbackType("Callback2");
}